

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

sunrealtype N_VL1NormLocal_ManyVector(N_Vector x)

{
  long *in_RDI;
  double dVar1;
  sunrealtype sum;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  undefined8 local_20;
  undefined8 local_18;
  
  local_20 = 0.0;
  for (local_18 = 0; local_18 < *(long *)*in_RDI; local_18 = local_18 + 1) {
    dVar1 = (double)N_VL1Norm(*(undefined8 *)(*(long *)(*in_RDI + 0x10) + local_18 * 8));
    local_20 = dVar1 + local_20;
  }
  return local_20;
}

Assistant:

sunrealtype MVAPPEND(N_VL1NormLocal)(N_Vector x)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i;
  sunrealtype sum;
#ifdef MANYVECTOR_BUILD_WITH_MPI
  sunrealtype contrib;
  int rank;
#endif

  /* initialize output*/
  sum = ZERO;

  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
#ifdef MANYVECTOR_BUILD_WITH_MPI

    /* check for nvl1normlocal in subvector */
    if (MANYVECTOR_SUBVEC(x, i)->ops->nvl1normlocal)
    {
      sum += N_VL1NormLocal(MANYVECTOR_SUBVEC(x, i));
      SUNCheckLastErrNoRet();

      /* otherwise, call nvl1norm and root tasks accumulate to overall sum */
    }
    else
    {
      contrib = N_VL1Norm(MANYVECTOR_SUBVEC(x, i));
      SUNCheckLastErrNoRet();

      /* get this task's rank in subvector communicator (note: serial
         subvectors will result in rank==0) */
      rank = SubvectorMPIRank(MANYVECTOR_SUBVEC(x, i));
      if (rank < 0) { return (ZERO); }
      if (rank == 0) { sum += contrib; }
    }

#else

    /* accumulate subvector contribution to overall sum */
    sum += N_VL1Norm(MANYVECTOR_SUBVEC(x, i));
    SUNCheckLastErrNoRet();

#endif
  }

  return (sum);
}